

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O1

void __thiscall QPainterPath::quadTo(QPainterPath *this,QPointF *c,QPointF *e)

{
  Element *pEVar1;
  QPainterPathPrivate *pQVar2;
  bool bVar3;
  long lVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  QPointF local_58;
  QPointF local_48;
  QPointF local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = hasValidCoords(*c);
  if (bVar3) {
    bVar3 = hasValidCoords(*e);
    if (bVar3) {
      if ((this->d_ptr).d.ptr == (QPainterPathPrivate *)0x0) {
        ensureData_helper(this);
      }
      detach(this);
      pQVar2 = (this->d_ptr).d.ptr;
      if (pQVar2 == (QPainterPathPrivate *)0x0) {
        lVar4 = -1;
      }
      else {
        lVar4 = (long)((int)(pQVar2->elements).d.size + -1);
      }
      pEVar1 = (pQVar2->elements).d.ptr + lVar4;
      local_38.xp = pEVar1->x;
      local_38.yp = pEVar1->y;
      bVar3 = qFuzzyCompare(&local_38,c);
      if (bVar3) {
        bVar3 = qFuzzyCompare(c,e);
        if (bVar3) goto LAB_003e5a36;
      }
      dVar5 = c->xp + c->xp;
      dVar6 = c->yp + c->yp;
      auVar7._0_8_ = local_38.xp + dVar5;
      auVar7._8_8_ = local_38.yp + dVar6;
      local_48 = (QPointF)divpd(auVar7,_DAT_006b05b0);
      auVar8._0_8_ = e->xp + dVar5;
      auVar8._8_8_ = e->yp + dVar6;
      local_58 = (QPointF)divpd(auVar8,_DAT_006b05b0);
      cubicTo(this,&local_48,&local_58,e);
    }
  }
LAB_003e5a36:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainterPath::quadTo(const QPointF &c, const QPointF &e)
{
#ifdef QPP_DEBUG
    printf("QPainterPath::quadTo() (%.2f,%.2f), (%.2f,%.2f)\n",
           c.x(), c.y(), e.x(), e.y());
#endif

    if (!hasValidCoords(c) || !hasValidCoords(e)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::quadTo: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    ensureData();
    detach();

    Q_D(QPainterPath);
    Q_ASSERT(!d->elements.isEmpty());
    const QPainterPath::Element &elm = d->elements.at(elementCount()-1);
    QPointF prev(elm.x, elm.y);

    // Abort on empty curve as a stroker cannot handle this and the
    // curve is irrelevant anyway.
    if (prev == c && c == e)
        return;

    QPointF c1((prev.x() + 2*c.x()) / 3, (prev.y() + 2*c.y()) / 3);
    QPointF c2((e.x() + 2*c.x()) / 3, (e.y() + 2*c.y()) / 3);
    cubicTo(c1, c2, e);
}